

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeQuantizationTransform::SetParameters
          (AttributeQuantizationTransform *this,int quantization_bits,float *min_values,
          int num_components,float range)

{
  bool bVar1;
  undefined4 in_ECX;
  vector<float,_std::allocator<float>_> *in_RDX;
  float in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  
  bVar1 = IsQuantizationValid((int)in_ESI);
  if (bVar1) {
    in_RDI[2] = in_ESI;
    std::vector<float,std::allocator<float>>::assign<float_const*,void>
              (in_RDX,(float *)CONCAT44(in_ECX,in_XMM0_Da),in_RDI);
    in_RDI[10] = in_XMM0_Da;
  }
  return bVar1;
}

Assistant:

bool AttributeQuantizationTransform::SetParameters(int quantization_bits,
                                                   const float *min_values,
                                                   int num_components,
                                                   float range) {
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;
  min_values_.assign(min_values, min_values + num_components);
  range_ = range;
  return true;
}